

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.hpp
# Opt level: O2

void __thiscall OpenMD::SectionParser::~SectionParser(SectionParser *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~SectionParser() = default;